

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O2

int __thiscall
re::beatnik::viterbi<float,_256L>::decode(viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  element<float> eVar1;
  
  calculate_transition(this,input);
  math::normalize<float,256l>((span<float,_256L>)&this->delta);
  eVar1 = math::element<float>::max<float_const*>((this->delta)._M_elems,(float *)&this->psi);
  return (int)(this->psi)._M_elems[eVar1.index];
}

Assistant:

int
    decode(gsl::span<T const, N> input) noexcept
    {
        calculate_transition(input);
        math::normalize(gsl::span<T, N>(delta));

        return psi[
            math::element<T>::max(
                std::cbegin(delta),
                std::cend(delta)
            ).index
        ];
    }